

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GenerateCustomRuleFile
          (cmMakefileTargetGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  cmGlobalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  ImplicitDependsList *pIVar2;
  pointer lang;
  string objFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string comment;
  string srcFullPath;
  ostringstream content;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [20];
  
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::ConstructComment_abi_cxx11_
            (&comment,&this->LocalGenerator->super_cmLocalGenerator,ccg,"");
  if ((comment._M_string_length != 0) &&
     (this->NumberOfProgressActions = this->NumberOfProgressActions + 1,
     this->NoRuleMessages == false)) {
    _content = (pointer)&local_198;
    local_198._M_local_buf[0] = '\0';
    local_188._M_p = (pointer)local_178;
    local_180 = 0;
    local_178[0]._M_local_buf[0] = '\0';
    MakeEchoProgress(this,(EchoProgress *)&content);
    this_00 = this->LocalGenerator;
    std::__cxx11::string::string
              ((string *)&objFullPath,comment._M_dataplus._M_p,(allocator *)&srcFullPath);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this_00,&commands,&objFullPath,EchoGenerate,(EchoProgress *)&content);
    std::__cxx11::string::~string((string *)&objFullPath);
    cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress((EchoProgress *)&content);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&content);
  cmLocalUnixMakefileGenerator3::AppendCustomCommand
            (this->LocalGenerator,&commands,ccg,this->Target,false,HOME_OUTPUT,(ostream *)&content);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalUnixMakefileGenerator3::AppendCustomDepend(this->LocalGenerator,&depends,ccg);
  outputs = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
  bVar1 = WriteMakeRule(this,(ostream *)this->BuildFileStream,(char *)0x0,outputs,&depends,&commands
                        ,false);
  if (!bVar1) {
    this_01 = this->GlobalGenerator;
    outputs_00 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    std::__cxx11::stringbuf::str();
    cmGlobalGenerator::AddRuleHash(&this_01->super_cmGlobalGenerator,outputs_00,&objFullPath);
    std::__cxx11::string::~string((string *)&objFullPath);
  }
  pIVar2 = cmCustomCommand::GetImplicitDepends(ccg->CC);
  lang = (pIVar2->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pIVar2 = cmCustomCommand::GetImplicitDepends(ccg->CC);
    if (lang == (pIVar2->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
    Convert(&objFullPath,this,
            (outputs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start,FULL,UNCHANGED);
    Convert(&srcFullPath,this,&lang->second,FULL,UNCHANGED);
    cmLocalUnixMakefileGenerator3::AddImplicitDepends
              (this->LocalGenerator,this->Target,&lang->first,objFullPath._M_dataplus._M_p,
               srcFullPath._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&srcFullPath);
    std::__cxx11::string::~string((string *)&objFullPath);
    lang = lang + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&content);
  std::__cxx11::string::~string((string *)&comment);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  return;
}

Assistant:

void cmMakefileTargetGenerator
::GenerateCustomRuleFile(cmCustomCommandGenerator const& ccg)
{
  // Collect the commands.
  std::vector<std::string> commands;
  std::string comment = this->LocalGenerator->ConstructComment(ccg);
  if(!comment.empty())
    {
    // add in a progress call if needed
    this->NumberOfProgressActions++;
    if(!this->NoRuleMessages)
      {
      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      this->MakeEchoProgress(progress);
      this->LocalGenerator
        ->AppendEcho(commands, comment.c_str(),
                     cmLocalUnixMakefileGenerator3::EchoGenerate,
                     &progress);
      }
    }

  // Now append the actual user-specified commands.
  std::ostringstream content;
  this->LocalGenerator->AppendCustomCommand(commands, ccg, this->Target, false,
                                            cmLocalGenerator::HOME_OUTPUT,
                                            &content);

  // Collect the dependencies.
  std::vector<std::string> depends;
  this->LocalGenerator->AppendCustomDepend(depends, ccg);

  // Write the rule.
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  bool symbolic = this->WriteMakeRule(*this->BuildFileStream, 0,
                                      outputs, depends, commands);

  // If the rule has changed make sure the output is rebuilt.
  if(!symbolic)
    {
    this->GlobalGenerator->AddRuleHash(ccg.GetOutputs(), content.str());
    }

  // Setup implicit dependency scanning.
  for(cmCustomCommand::ImplicitDependsList::const_iterator
        idi = ccg.GetCC().GetImplicitDepends().begin();
      idi != ccg.GetCC().GetImplicitDepends().end(); ++idi)
    {
    std::string objFullPath =
      this->Convert(outputs[0], cmLocalGenerator::FULL);
    std::string srcFullPath =
      this->Convert(idi->second, cmLocalGenerator::FULL);
    this->LocalGenerator->
      AddImplicitDepends(*this->Target, idi->first,
                         objFullPath.c_str(),
                         srcFullPath.c_str());
    }
}